

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dB-hash.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulint *puVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  uint unaff_EBP;
  undefined1 auVar9 [16];
  string out;
  string in;
  string pattern;
  DBhash dBhash;
  vector<unsigned_long,_std::allocator<unsigned_long>_> occ;
  char *local_5f0;
  long local_5e8;
  char local_5e0 [16];
  char *local_5d0;
  long local_5c8;
  char local_5c0 [16];
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  DBhash local_530;
  DBhash local_2b0;
  
  if (argc != 4) {
    std::operator<<((ostream *)&std::cout,"*** dB-hash data structure ***\n");
    std::operator<<((ostream *)&std::cout,"Usage: dB-hash option file [pattern] [pattern_length]\n")
    ;
    std::operator<<((ostream *)&std::cout,"where: \n");
    std::operator<<((ostream *)&std::cout,"- option = build|search.\n");
    std::operator<<((ostream *)&std::cout,
                    "- file = path of the text file (if build mode) or dB-hash .dbh file (if search mode). \n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "- pattern_length = In build mode, specify this parameter, which is the pattern length\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "- pattern = must be specified in search mode. It is the pattern to be searched in the index.\n"
                   );
LAB_0010b479:
    exit(0);
  }
  std::__cxx11::string::string((string *)&local_530,argv[1],(allocator *)&local_2b0);
  iVar4 = std::__cxx11::string::compare((char *)&local_530);
  puVar2 = &local_530.w;
  if ((ulint *)local_530.n != puVar2) {
    operator_delete((void *)local_530.n);
  }
  if (iVar4 != 0) {
    std::__cxx11::string::string((string *)&local_530,argv[1],(allocator *)&local_2b0);
    unaff_EBP = std::__cxx11::string::compare((char *)&local_530);
    if ((ulint *)local_530.n != puVar2) {
      operator_delete((void *)local_530.n);
    }
    if (unaff_EBP != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Unrecognized option ");
      poVar6 = std::operator<<(poVar6,argv[1]);
      std::endl<char,std::char_traits<char>>(poVar6);
      goto LAB_0010b479;
    }
  }
  std::__cxx11::string::string((string *)&local_5d0,argv[2],(allocator *)&local_530);
  local_5f0 = local_5e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_5f0,local_5d0,local_5d0 + local_5c8);
  std::__cxx11::string::append((char *)&local_5f0);
  paVar1 = &local_5b0.field_2;
  local_5b0._M_string_length = 0;
  local_5b0.field_2._M_local_buf[0] = '\0';
  local_5b0._M_dataplus._M_p = (pointer)paVar1;
  if (iVar4 != 0) {
    std::__cxx11::string::string((string *)&local_530,argv[3],(allocator *)&local_2b0);
    std::__cxx11::string::operator=((string *)&local_5b0,(string *)&local_530);
    if ((ulint *)local_530.n != puVar2) {
      operator_delete((void *)local_530.n);
    }
    unaff_EBP = (uint)local_5b0._M_string_length;
  }
  if (iVar4 == 0) {
    unaff_EBP = atoi(argv[3]);
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  local_530.h.Z.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_530.h.Z_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_530.h.Z_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_530.h.Z_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_530.h.code.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_530.h.code.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_530.h.code.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_530.h.random_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_530.h.random_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_530.h.random_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_530.h.Z.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_530.h.Z.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_530.indexedBWT.bwt_wt.nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_530.indexedBWT.bwt_wt.nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_530.indexedBWT.bwt_wt.nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_530.indexedBWT.marked_positions.n = 0;
  local_530.indexedBWT.marked_positions.bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_530.indexedBWT.marked_positions.bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_530.indexedBWT.marked_positions.bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ = 0;
  local_530.indexedBWT.marked_positions.bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._2_6_ = 0;
  local_530.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start._0_2_ = 0;
  local_530.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start._2_6_ = 0;
  local_530.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_2_ = 0;
  local_530.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish._2_6_ = 0;
  local_530.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ = 0;
  local_530.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._2_6_ = 0;
  local_530.indexedBWT.marked_positions.rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0;
  local_530.indexedBWT.marked_positions.rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start._2_6_ = 0;
  local_530.indexedBWT.marked_positions.rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish._0_2_ = 0;
  local_530.indexedBWT.marked_positions.rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._10_8_ = 0;
  local_530.indexedBWT.marked_positions._74_8_ = 0;
  local_530.indexedBWT.marked_positions._82_8_ = 0;
  local_530.indexedBWT.text_pointers._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_530.indexedBWT.text_pointers._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_530.indexedBWT.text_pointers._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_530.indexedBWT.text_pointers._size = 0;
  local_530.indexedBWT.text_pointers._width = 0;
  local_530.indexedBWT.text_pointers._field_mask = 0;
  local_530.indexedBWT.FIRST.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_530.indexedBWT.FIRST.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_530.indexedBWT.FIRST.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_530.indexedBWT.remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_530.indexedBWT.remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_530.indexedBWT.remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_530.indexedBWT.inverse_remapping.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_530.indexedBWT.inverse_remapping.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_530.indexedBWT.inverse_remapping.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_530.text_wv._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_530.text_wv._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_530.text_wv._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_530.text_wv._size = 0;
  local_530.text_wv._width = 0;
  local_530.text_wv._field_mask = 0;
  local_530.auxiliary_hash._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_530.auxiliary_hash._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_530.auxiliary_hash._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_530.auxiliary_hash._size = 0;
  local_530.auxiliary_hash._width = 0;
  local_530.auxiliary_hash._field_mask = 0;
  local_530.char_to_int.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_530.char_to_int.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_530.char_to_int.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_530.int_to_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_530.int_to_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_530.int_to_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Building dB-hash of file ",0x19);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_5d0,local_5c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_550,local_5d0,local_5d0 + local_5c8);
    buildFromFile(&local_2b0,&local_550,unaff_EBP);
    bwtil::DBhash::operator=(&local_530,&local_2b0);
    bwtil::DBhash::~DBhash(&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      operator_delete(local_550._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nStoring dB-hash in ",0x14);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_5f0,local_5e8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_570,local_5f0,local_5f0 + local_5e8);
    bwtil::DBhash::saveToFile(&local_530,&local_570);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._M_dataplus._M_p != &local_570.field_2) {
      operator_delete(local_570._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done.\n",6);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Loading dB-hash from file ",0x1a);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_5d0,local_5c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_590,local_5d0,local_5d0 + local_5c8);
    bwtil::DBhash::loadFromFile(&local_2b0,&local_590);
    bwtil::DBhash::operator=(&local_530,&local_2b0);
    bwtil::DBhash::~DBhash(&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done.",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    if (local_530.m != unaff_EBP) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: structure built with pattern length ",0x2b);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,", but now searching a pattern of length ",0x28);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      exit(1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nSearching pattern ",0x13);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_5b0._M_dataplus._M_p,local_5b0._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    bwtil::DBhash::getOccurrencies
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2b0,&local_530,
               &local_5b0,0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The pattern occurs ",0x13);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," times in the text at the following positions : \n",0x31);
    if (local_2b0.m != local_2b0.n) {
      uVar8 = 1;
      do {
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        bVar3 = uVar8 < (ulong)((long)(local_2b0.m - local_2b0.n) >> 3);
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\nDone.\n",8);
    if ((void *)local_2b0.n != (void *)0x0) {
      operator_delete((void *)local_2b0.n);
    }
  }
  bwtil::printRSSstat();
  lVar7 = std::chrono::_V2::system_clock::now();
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (double)(lVar7 - lVar5) * 1e-09;
  uVar8 = vcvttsd2usi_avx512f(auVar9);
  if (uVar8 < 0xe10) {
    if (uVar8 < 0x3c) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time: ",0xc);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"s",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time: ",0xc);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"m ",2);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"s",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time: ",0xc);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"h ",2);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"m ",2);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"s",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  bwtil::DBhash::~DBhash(&local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_5b0._M_dataplus._M_p);
  }
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0);
  }
  if (local_5d0 != local_5c0) {
    operator_delete(local_5d0);
  }
  return 0;
}

Assistant:

int main(int argc,char** argv) {

	if(argc != 4){
		cout << "*** dB-hash data structure ***\n";
		cout << "Usage: dB-hash option file [pattern] [pattern_length]\n";
		cout << "where: \n";
		cout <<	"- option = build|search.\n";
		cout <<	"- file = path of the text file (if build mode) or dB-hash .dbh file (if search mode). \n";
		cout << "- pattern_length = In build mode, specify this parameter, which is the pattern length\n";
		cout << "- pattern = must be specified in search mode. It is the pattern to be searched in the index.\n";
		exit(0);
	}

    using std::chrono::high_resolution_clock;
    using std::chrono::duration_cast;
    using std::chrono::duration;

	int build=0,search=1;

	int mode;

	if(string(argv[1]).compare("build")==0)
		mode=build;
	else if(string(argv[1]).compare("search")==0)
		mode=search;
	else{
		cout << "Unrecognized option "<<argv[1]<<endl;
		exit(0);
	}

	string in = string(argv[2]);
	string out = string(in);
	out.append(".dbh");

	uint m;

	string pattern;

	if(mode==search){
		pattern = string(argv[3]);
		m = pattern.length();
	}

	if(mode==build)
		m = atoi(argv[3]);

    auto t1 = high_resolution_clock::now();

	DBhash dBhash;

	if(mode==build){


		cout << "Building dB-hash of file "<< in << endl;
		dBhash = buildFromFile(in,m);

		cout << "\nStoring dB-hash in "<< out<<endl;
		dBhash.saveToFile(out);

		cout << "Done.\n";

	}

	if(mode==search){

		cout << "Loading dB-hash from file "<< in <<endl;
		dBhash = DBhash::loadFromFile(in);
		cout << "Done." << endl;

		if(dBhash.patternLength()!=m){
			cout << "Error: structure built with pattern length " << dBhash.patternLength() << ", but now searching a pattern of length " << m << endl;
			exit(1);
		}

		cout << "\nSearching pattern "<< pattern <<endl;

		vector<ulint> occ = dBhash.getOccurrencies( pattern );

		cout << "The pattern occurs " << occ.size() << " times in the text at the following positions : \n";

		for(uint i=0;i<occ.size();i++)
			cout << occ.at(i) << " ";

		cout << "\n\nDone.\n";

	}

	printRSSstat();
	auto t2 = high_resolution_clock::now();
	ulint total = duration_cast<duration<double, std::ratio<1>>>(t2 - t1).count();

	if(total>=3600){

		uint h = total/3600;
		uint m = (total%3600)/60;
		uint s = (total%3600)%60;

		cout << "Total time: " << h << "h " << m << "m " << s << "s" << endl;

	}else if (total>=60){

		uint m = total/60;
		uint s = total%60;

		cout << "Total time: " << m << "m " << s << "s" << endl;

	}else{

		cout << "Total time: " << total << "s" << endl;

	}
}